

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  allocator local_d1;
  value_type oneof;
  Iterator __begin3;
  string local_b8;
  Iterator __end3;
  string local_88;
  Formatter format;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\0') {
    GenerateFieldAccessorDefinitions(this,printer);
    __begin3.descriptor = this->descriptor_;
    __begin3.idx = 0;
    __end3.idx = *(int *)(__begin3.descriptor + 0x6c);
    __end3.descriptor = __begin3.descriptor;
    while( true ) {
      bVar1 = operator!=(&__begin3,&__end3);
      if (!bVar1) break;
      oneof = (value_type)((long)__begin3.idx * 0x28 + *(long *)(__begin3.descriptor + 0x30));
      format.printer_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
      std::__cxx11::string::string((string *)&local_b8,"camel_oneof_name",&local_d1);
      UnderscoresToCamelCase(&local_88,*(string **)(oneof + 8),true);
      Formatter::Set<std::__cxx11::string>(&format,&local_b8,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)&local_b8,"oneof_name",(allocator *)&local_88);
      Formatter::Set<std::__cxx11::string>
                (&format,&local_b8,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(oneof + 8))
      ;
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)&local_b8,"oneof_index",&local_d1);
      local_88._M_dataplus._M_p._0_4_ =
           (undefined4)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) / 0x28);
      Formatter::Set<int>(&format,&local_b8,(int *)&local_88);
      std::__cxx11::string::~string((string *)&local_b8);
      Formatter::operator()
                (&format,
                 "inline $classname$::$camel_oneof_name$Case $classname$::${1$$oneof_name$_case$}$() const {\n  return $classname$::$camel_oneof_name$Case(_oneof_case_[$oneof_index$]);\n}\n"
                 ,&oneof);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&format.vars_._M_t);
      __begin3.idx = __begin3.idx + 1;
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(printer);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(printer, variables_);
    format.Set("camel_oneof_name", UnderscoresToCamelCase(oneof->name(), true));
    format.Set("oneof_name", oneof->name());
    format.Set("oneof_index", oneof->index());
    format(
        "inline $classname$::$camel_oneof_name$Case $classname$::"
        "${1$$oneof_name$_case$}$() const {\n"
        "  return $classname$::$camel_oneof_name$Case("
        "_oneof_case_[$oneof_index$]);\n"
        "}\n",
        oneof);
  }
}